

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O1

IDeckLinkEncoderInputCallback *
cdecklink_internal_callback_create_deck_link_encoder_input_callback
          (void *ctx,undefined1 *cb0,cdecklink_encoder_input_callback_video_packet_arrived *cb1,
          cdecklink_encoder_input_callback_audio_packet_arrived *cb2)

{
  IDeckLinkEncoderInputCallback *pIVar1;
  
  if ((cb0 != (undefined1 *)0x0 ||
      cb1 != (cdecklink_encoder_input_callback_video_packet_arrived *)0x0) ||
      cb2 != (cdecklink_encoder_input_callback_audio_packet_arrived *)0x0) {
    pIVar1 = (IDeckLinkEncoderInputCallback *)operator_new(0x30);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108ba8;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    pIVar1[4].super_IUnknown._vptr_IUnknown = (_func_int **)cb1;
    pIVar1[5].super_IUnknown._vptr_IUnknown = (_func_int **)cb2;
    return pIVar1;
  }
  return (IDeckLinkEncoderInputCallback *)0x0;
}

Assistant:

IDeckLinkEncoderInputCallback* cdecklink_internal_callback_create_deck_link_encoder_input_callback (void *ctx, cdecklink_encoder_input_callback_video_input_signal_changed *cb0, cdecklink_encoder_input_callback_video_packet_arrived *cb1, cdecklink_encoder_input_callback_audio_packet_arrived *cb2) {
	if (cb0 != nullptr || cb1 != nullptr || cb2 != nullptr) {
		return new DeckLinkEncoderInputCallback(ctx, cb0, cb1, cb2);
	}
	return nullptr;
}